

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::process_connections(Server *this)

{
  bool bVar1;
  reference ppCVar2;
  _Self local_20;
  _Self local_18;
  iterator i;
  Server *this_local;
  
  i._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<Connection_*,_std::allocator<Connection_*>_>::begin(&this->connections);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<Connection_*,_std::allocator<Connection_*>_>::end(&this->connections);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppCVar2 = std::_List_iterator<Connection_*>::operator*(&local_18);
    Connection::exchange_data(*ppCVar2,&this->rdfds,&this->wrfds);
    std::_List_iterator<Connection_*>::operator++(&local_18);
  }
  return;
}

Assistant:

void Server::process_connections() {
    for (auto i = connections.begin(); i != connections.end(); ++i) {
        (*i)->exchange_data(rdfds, wrfds);
    }
}